

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.h
# Opt level: O2

string * __thiscall
google::protobuf::compiler::cpp::Formatter::ToString<unsigned_char,void>
          (string *__return_storage_ptr__,Formatter *this,uchar x)

{
  undefined1 extraout_DL;
  undefined7 extraout_var;
  AlphaNum local_40;
  
  strings::AlphaNum::AlphaNum(&local_40,(int)this);
  StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_40,
                    (AlphaNum *)CONCAT71(extraout_var,extraout_DL));
  return __return_storage_ptr__;
}

Assistant:

static std::string ToString(I x) {
    return StrCat(x);
  }